

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVectorTests.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_965823::Constructable::~Constructable(Constructable *this)

{
  StringRef capturedExpression;
  StringRef macroName;
  SourceLineInfo local_60;
  AssertionHandler catchAssertionHandler;
  
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/util/SmallVectorTests.cpp"
  ;
  local_60.line = 0x2e;
  capturedExpression.m_size = 0xb;
  capturedExpression.m_start = "constructed";
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,&local_60,capturedExpression,ContinueOnFailure);
  local_60.file = (char *)CONCAT71(local_60.file._1_7_,this->constructed);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_60);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  (anonymous_namespace)::Constructable::numDestructorCalls =
       (anonymous_namespace)::Constructable::numDestructorCalls + 1;
  this->constructed = false;
  this->value = 0;
  return;
}

Assistant:

~Constructable() {
        CHECK(constructed);
        ++numDestructorCalls;
        constructed = false;
        value = 0;
    }